

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

Sampler * vkt::texture::util::createSampler
                    (Sampler *__return_storage_ptr__,WrapMode wrapU,WrapMode wrapV,WrapMode wrapW,
                    FilterMode minFilterMode,FilterMode magFilterMode)

{
  Vector<float,_4> local_2c;
  FilterMode local_1c;
  FilterMode local_18;
  FilterMode magFilterMode_local;
  FilterMode minFilterMode_local;
  WrapMode wrapW_local;
  WrapMode wrapV_local;
  WrapMode wrapU_local;
  
  local_1c = magFilterMode;
  local_18 = minFilterMode;
  magFilterMode_local = wrapW;
  minFilterMode_local = wrapV;
  wrapW_local = wrapU;
  tcu::Vector<float,_4>::Vector(&local_2c,0.0);
  tcu::Sampler::Sampler
            (__return_storage_ptr__,wrapU,wrapV,wrapW,minFilterMode,magFilterMode,0.0,true,
             COMPAREMODE_NONE,0,&local_2c,false,MODE_DEPTH);
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler createSampler (tcu::Sampler::WrapMode wrapU, tcu::Sampler::WrapMode wrapV, tcu::Sampler::WrapMode wrapW, tcu::Sampler::FilterMode minFilterMode, tcu::Sampler::FilterMode magFilterMode)
{
	return tcu::Sampler(wrapU, wrapV, wrapW,
						minFilterMode, magFilterMode,
						0.0f /* lod threshold */,
						true /* normalized coords */,
						tcu::Sampler::COMPAREMODE_NONE /* no compare */,
						0 /* compare channel */,
						tcu::Vec4(0.0f) /* border color, not used */);
}